

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsk.c
# Opt level: O0

int get_version_array(char *dir,char *file)

{
  int iVar1;
  int *piVar2;
  DIR *__dirp;
  ulong uVar3;
  bool bVar4;
  char *local_2f8;
  char *lf_cp_1;
  char *lf_cp;
  stat sbuf;
  dirent *pdStack_250;
  int rval;
  dirent *dp;
  DIR *dirp;
  char local_238 [4];
  int varray_index;
  char ver [16];
  char name [255];
  char lcased_file [255];
  char *file_local;
  char *dir_local;
  
  dirp._4_4_ = 0;
  strcpy(name + 0xf8,file);
  separate_version(name + 0xf8,local_238,1);
  for (lf_cp_1 = name + 0xf8; *lf_cp_1 != '\0'; lf_cp_1 = lf_cp_1 + 1) {
    if (('@' < *lf_cp_1) && (*lf_cp_1 < '[')) {
      *lf_cp_1 = *lf_cp_1 + ' ';
    }
  }
  alarm(TIMEOUT_TIME);
  do {
    piVar2 = __errno_location();
    *piVar2 = 0;
    sbuf.__glibc_reserved[2]._4_4_ = stat(dir,(stat *)&lf_cp);
    bVar4 = false;
    if (sbuf.__glibc_reserved[2]._4_4_ == -1) {
      piVar2 = __errno_location();
      bVar4 = *piVar2 == 4;
    }
  } while (bVar4);
  alarm(0);
  if (sbuf.__glibc_reserved[2]._4_4_ == -1) {
    piVar2 = __errno_location();
    *Lisp_errno = *piVar2;
    dir_local._4_4_ = 0;
  }
  else if ((((sbuf.st_dev == VA.dir_ino) && (iVar1 = strcmp(name + 0xf8,VA.name), iVar1 == 0)) &&
           (sbuf.st_atim.tv_nsec == VA.lastMTime.tv_sec)) &&
          (sbuf.st_mtim.tv_sec == VA.lastMTime.tv_nsec)) {
    dir_local._4_4_ = 1;
  }
  else {
    VA.dir_ino = sbuf.st_dev;
    VA.lastMTime.tv_sec = sbuf.st_atim.tv_nsec;
    VA.lastMTime.tv_nsec = sbuf.st_mtim.tv_sec;
    strcpy(VA.name,name + 0xf8);
    piVar2 = __errno_location();
    *piVar2 = 0;
    alarm(TIMEOUT_TIME);
    do {
      piVar2 = __errno_location();
      *piVar2 = 0;
      __dirp = opendir(dir);
      bVar4 = false;
      if (__dirp == (DIR *)0x0) {
        piVar2 = __errno_location();
        bVar4 = *piVar2 == 4;
      }
    } while (bVar4);
    alarm(0);
    if (__dirp == (DIR *)0x0) {
      piVar2 = __errno_location();
      *Lisp_errno = *piVar2;
      dir_local._4_4_ = 0;
    }
    else {
      if (VA.files == (FileName *)0x0) {
        VA.files = (FileName *)calloc(200,0x1004);
        VA.allocated = 200;
      }
      alarm(TIMEOUT_TIME);
      pdStack_250 = readdir(__dirp);
      alarm(0);
      while( true ) {
        bVar4 = true;
        if (pdStack_250 == (dirent *)0x0) {
          piVar2 = __errno_location();
          bVar4 = *piVar2 == 4;
        }
        if (!bVar4) break;
        if (pdStack_250 != (dirent *)0x0) {
          strcpy(ver + 8,pdStack_250->d_name);
          separate_version(ver + 8,local_238,1);
          for (local_2f8 = ver + 8; *local_2f8 != '\0'; local_2f8 = local_2f8 + 1) {
            if (('@' < *local_2f8) && (*local_2f8 < '[')) {
              *local_2f8 = *local_2f8 + ' ';
            }
          }
          iVar1 = strcmp(ver + 8,name + 0xf8);
          if (iVar1 == 0) {
            strcpy(VA.files[dirp._4_4_].name,pdStack_250->d_name);
            if (local_238[0] == '\0') {
              VA.files[dirp._4_4_].version_no = 0;
            }
            else {
              uVar3 = strtoul(local_238,(char **)0x0,10);
              VA.files[dirp._4_4_].version_no = (uint)uVar3;
            }
            dirp._4_4_ = dirp._4_4_ + 1;
            if (1999 < dirp._4_4_) {
              *Lisp_errno = 5;
              return 0;
            }
            if (VA.allocated <= dirp._4_4_) {
              VA.allocated = VA.allocated + 200;
              VA.files = (FileName *)realloc(VA.files,(long)VA.allocated * 0x1004);
            }
          }
        }
        piVar2 = __errno_location();
        *piVar2 = 0;
        alarm(TIMEOUT_TIME);
        pdStack_250 = readdir(__dirp);
        alarm(0);
      }
      VA.files[dirp._4_4_].version_no = 0xffffffff;
      VA.lastUsed = dirp._4_4_;
      if ((VA.files)->version_no != 0xffffffff) {
        strcpy(ver + 8,(VA.files)->name);
        separate_version(ver + 8,local_238,1);
        strcpy(VA.files[dirp._4_4_].name,ver + 8);
        if (1 < dirp._4_4_) {
          qsort(VA.files,(long)dirp._4_4_,0x1004,compare_file_versions);
        }
      }
      alarm(TIMEOUT_TIME);
      do {
        piVar2 = __errno_location();
        *piVar2 = 0;
        iVar1 = closedir(__dirp);
        bVar4 = false;
        if (iVar1 == -1) {
          piVar2 = __errno_location();
          bVar4 = *piVar2 == 4;
        }
      } while (bVar4);
      alarm(0);
      dir_local._4_4_ = 1;
    }
  }
  return dir_local._4_4_;
}

Assistant:

static int get_version_array(char *dir, char *file)
{
#ifdef DOS
  /* DOS version-array builder */
  char lcased_file[MAXPATHLEN];
  char old_file[MAXPATHLEN];
  char name[MAXNAMLEN];
  char ver[VERSIONLEN];
  int varray_index = 0;
  struct find_t dirp;
  struct direct *dp;
  int rval, drive = 0, isslash = 0;
  struct stat sbuf;
  int res;

  /*
   * First of all, prepare a lower cased file name for the case insensitive
   * search.  Also we have to separate file name from its version field.
   */
  if (dir[1] == DRIVESEP) drive = dir[0];

  if (strcmp(dir, "\\") == 0)
    isslash = 1;
  else if (drive && (strcmp(dir + 2, "\\") == 0))
    isslash = 1;

  if (!isslash)
    strcpy(lcased_file, dir); /* Only add the dir if it's real */
  else if (drive) {
    lcased_file[0] = drive;
    lcased_file[1] = DRIVESEP;
    lcased_file[2] = '\0';
  } else
    *lcased_file = '\0';

  /*  strcpy(lcased_file, dir);   removed when above code added 3/4/93 */
  strcat(lcased_file, DIRSEPSTR);
  strcat(lcased_file, file);
  separate_version(lcased_file, ver, 1);
  DOWNCASE(lcased_file);

  /*************************************************/
  /* First, look up the backup version of the file */
  /*************************************************/

  /* First, make the "backup-file-name" for this file */

  make_old_version(old_file, lcased_file);

  TIMEOUT(res = _dos_findfirst(old_file, _A_NORMAL | _A_SUBDIR, &dirp));
  if (res == 0) {
    strcpy(name, dirp.name);
    strcpy(VA.files[varray_index].name, name);
    VA.files[varray_index].version_no = 0;
    varray_index++;
  }

  /*******************************/
  /* Now look up the file itself */
  /*******************************/

  TIMEOUT(res = _dos_findfirst(lcased_file, _A_NORMAL | _A_SUBDIR, &dirp));
  /*    if (res != 0)
        {
          *Lisp_errno = errno;
          return(0);
        }
  */
  for (; res == 0; S_TOUT(res = _dos_findnext(&dirp))) {
    strcpy(name, dirp.name);
    separate_version(name, ver, 1);
    DOWNCASE(name);

    strcpy(VA.files[varray_index].name, dirp.name);
    if (*ver == '\0') {
      /* Versionless file */
      VA.files[varray_index].version_no = 1;
    } else {
      /*
       * separate_version guarantees ver is a numeric string.
       */
      VA.files[varray_index].version_no = strtoul(ver, (char **)NULL, 10);
    }
    varray_index++;
    if (varray_index >= VERSIONARRAYMAXLENGTH) {
      *Lisp_errno = EIO;
      return (0);
    } else if (varray_index >= VA.allocated) {
      VA.allocated += VERSIONARRAYCHUNKLENGTH;
      VA.files = realloc(VA.files,
                             sizeof(*VA.files) * VA.allocated);
    }
  }

  /*
   * The last entry of VA.files is indicated by setting LASTVERSIONARRAY into
   * version_no field.
   */
  VA.files[varray_index].version_no = LASTVERSIONARRAY;
  VA.lastUsed = varray_index;

  /*
   * If any files have been stored in VA.files, we store the name
   * without version in the last marker entry.
   *
   * NOTE: sorting "varray_index" entries will leave the LASTVERSIONARRAY item
   * untouched by the sort, which is intentional.
   */
  if (!NoFileP(VA.files)) {
    strcpy(name, VA.files[0].name);
    separate_version(name, ver, 1);
    strcpy(VA.files[varray_index].name, name);
    if (varray_index > 1) {
      qsort(VA.files, varray_index, sizeof(*VA.files), compare_file_versions);
    }
  }

  return (1);

#else
  /* UNIX version-array builder */
  char lcased_file[MAXNAMLEN];
  char name[MAXNAMLEN];
  char ver[VERSIONLEN];
  int varray_index = 0;
  DIR *dirp;
  struct dirent *dp;
  int rval;
  struct stat sbuf;

  /*
   * First of all, prepare a lower cased file name for the case insensitive
   * search.  Also we have to separate file name from its version field.
   */
  strcpy(lcased_file, file);
  separate_version(lcased_file, ver, 1);
  DOWNCASE(lcased_file);

  /* Cache for VA.files reinstated using nanosecond timestamps which many
   * systems provide for directory modification times.
   * POSIX defines the struct stat field containing the nanosecond resolution
   * modification time as "st_mtim".  See "version.h" for accomodations
   * for systems that call it something else (e.g., macOS st_mtimespec).
   */

  TIMEOUT(rval = stat(dir, &sbuf));
  if (rval == -1) {
    *Lisp_errno = errno;
    return(0);
  }
  if (sbuf.st_ino == VA.dir_ino &&
      0 == strcmp(lcased_file, VA.name) &&
      sbuf.st_mtim.tv_sec == VA.lastMTime.tv_sec &&
      sbuf.st_mtim.tv_nsec == VA.lastMTime.tv_nsec) {
    return (1);
  } else {
    VA.dir_ino = sbuf.st_ino;
    VA.lastMTime = sbuf.st_mtim;
    strcpy(VA.name, lcased_file);
  }

  errno = 0;
  TIMEOUT0(dirp = opendir(dir));
  if (dirp == NULL) {
    *Lisp_errno = errno;
    return (0);
  }

  /* There is no initialization call for the local file system, so we
   * must ensure there is initial storage allocated for the version array */
  if (VA.files == NULL) {
    VA.files = calloc(VERSIONARRAYCHUNKLENGTH, sizeof(*VA.files));
    VA.allocated = VERSIONARRAYCHUNKLENGTH;
  }
  for (S_TOUT(dp = readdir(dirp)); dp != NULL || errno == EINTR;
       errno = 0, S_TOUT(dp = readdir(dirp)))
    if (dp) {
      strcpy(name, dp->d_name);
      separate_version(name, ver, 1);
      DOWNCASE(name);
      if (strcmp(name, lcased_file) == 0) {
        /*
         * This file can be regarded as a same file in Lisp sense.
         */
        strcpy(VA.files[varray_index].name, dp->d_name);
        if (*ver == '\0') {
          /* Versionless file */
          VA.files[varray_index].version_no = 0;
        } else {
          /*
           * separate_version guarantees ver is a numeric string.
           */
          VA.files[varray_index].version_no = strtoul(ver, (char **)NULL, 10);
        }
        varray_index++;
        if (varray_index >= VERSIONARRAYMAXLENGTH) {
          *Lisp_errno = EIO;
          return (0);
        } else if (varray_index >= VA.allocated) {
          VA.allocated += VERSIONARRAYCHUNKLENGTH;
          VA.files = realloc(VA.files,
                                 sizeof(*VA.files) * VA.allocated);
        }
      }
    }
  /*
   * The last entry of varray is indicated by setting LASTVERSIONARRAY into
   * version_no field.
   */
  VA.files[varray_index].version_no = LASTVERSIONARRAY;
  VA.lastUsed = varray_index;

  /*
   * If any files have been stored in VA.files, we store the name
   * without version in the last marker entry.
   *
   * NOTE: sorting "varray_index" entries will leave the LASTVERSIONARRAY item
   * untouched by the sort, which is intentional.
   */
  if (!NoFileP(VA.files)) {
    strcpy(name, VA.files[0].name);
    separate_version(name, ver, 1);
    strcpy(VA.files[varray_index].name, name);
    if (varray_index > 1) {
      qsort(VA.files, varray_index, sizeof(*VA.files), compare_file_versions);
    }
  }

  TIMEOUT(closedir(dirp));
  return (1);
#endif /* DOS */
}